

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O0

int envy_bios_parse_spreadspectrum(envy_bios *bios)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  envy_bios_spreadspectrum *peVar9;
  envy_bios_spreadspectrum_entry *peVar10;
  envy_bios_spreadspectrum_entry *entry;
  int i;
  int wantrlen;
  int wanthlen;
  int err;
  envy_bios_spreadspectrum *spreadspectrum;
  envy_bios *bios_local;
  
  peVar9 = &bios->spreadspectrum;
  if (peVar9->offset == 0) {
    bios_local._4_4_ = 0;
  }
  else {
    iVar2 = bios_u8(bios,(uint)peVar9->offset,&(bios->spreadspectrum).version);
    iVar3 = bios_u8(bios,peVar9->offset + 1,&(bios->spreadspectrum).hlen);
    iVar4 = bios_u8(bios,peVar9->offset + 2,&(bios->spreadspectrum).entriesnum);
    iVar5 = bios_u8(bios,peVar9->offset + 3,&(bios->spreadspectrum).rlen);
    if (iVar5 == 0 && (iVar4 == 0 && (iVar3 == 0 && iVar2 == 0))) {
      envy_bios_block(bios,(uint)peVar9->offset,
                      (uint)(bios->spreadspectrum).hlen +
                      (uint)(bios->spreadspectrum).rlen * (uint)(bios->spreadspectrum).entriesnum,
                      "SPREADSPECTRUM",-1);
      uVar1 = (bios->spreadspectrum).version;
      if ((uVar1 == '1') || (uVar1 == '@')) {
        i = 10;
        entry._4_4_ = 1;
        iVar2 = bios_u8(bios,peVar9->offset + 4,&(bios->spreadspectrum).unk04);
        iVar3 = bios_u8(bios,peVar9->offset + 5,&(bios->spreadspectrum).unk05);
        iVar4 = bios_u8(bios,peVar9->offset + 6,&(bios->spreadspectrum).unk06);
        iVar5 = bios_u8(bios,peVar9->offset + 7,&(bios->spreadspectrum).unk07);
        iVar6 = bios_u8(bios,peVar9->offset + 8,&(bios->spreadspectrum).unk08);
        iVar7 = bios_u8(bios,peVar9->offset + 9,&(bios->spreadspectrum).unk09);
        if (iVar7 != 0 || (iVar6 != 0 || (iVar5 != 0 || (iVar4 != 0 || (iVar3 != 0 || iVar2 != 0))))
           ) {
          return -0xe;
        }
      }
      else {
        if (uVar1 != 'A') {
          fprintf(_stderr,"Unknown SPREADSPECTRUM table version %d.%d\n",
                  (ulong)(uint)((int)(uint)(bios->spreadspectrum).version >> 4),
                  (ulong)((bios->spreadspectrum).version & 0xf));
          return -0x16;
        }
        i = 5;
        entry._4_4_ = 1;
        if (1 < (bios->spreadspectrum).rlen) {
          entry._4_4_ = 2;
        }
        iVar2 = bios_u8(bios,peVar9->offset + 4,&(bios->spreadspectrum).unk04);
        if (iVar2 != 0) {
          return -0xe;
        }
      }
      wantrlen = 0;
      if ((uint)(bios->spreadspectrum).hlen < (uint)i) {
        fprintf(_stderr,"SPREADSPECTRUM table header too short [%d < %d]\n",
                (ulong)(bios->spreadspectrum).hlen,(ulong)(uint)i);
        bios_local._4_4_ = -0x16;
      }
      else if ((bios->spreadspectrum).rlen < entry._4_4_) {
        fprintf(_stderr,"SPREADSPECTRUM table record too short [%d < %d]\n",
                (ulong)(bios->spreadspectrum).rlen,(ulong)entry._4_4_);
        bios_local._4_4_ = -0x16;
      }
      else {
        if ((uint)i < (uint)(bios->spreadspectrum).hlen) {
          fprintf(_stderr,"SPREADSPECTRUM table header longer than expected [%d > %d]\n",
                  (ulong)(bios->spreadspectrum).hlen,(ulong)(uint)i);
        }
        if (entry._4_4_ < (bios->spreadspectrum).rlen) {
          fprintf(_stderr,"SPREADSPECTRUM table record longer than expected [%d > %d]\n",
                  (ulong)(bios->spreadspectrum).rlen,(ulong)entry._4_4_);
        }
        peVar10 = (envy_bios_spreadspectrum_entry *)
                  calloc((ulong)(bios->spreadspectrum).entriesnum,4);
        (bios->spreadspectrum).entries = peVar10;
        if ((bios->spreadspectrum).entries == (envy_bios_spreadspectrum_entry *)0x0) {
          bios_local._4_4_ = -0xc;
        }
        else {
          for (entry._0_4_ = 0; (int)entry < (int)(uint)(bios->spreadspectrum).entriesnum;
              entry._0_4_ = (int)entry + 1) {
            peVar10 = (bios->spreadspectrum).entries + (int)entry;
            peVar10->offset =
                 peVar9->offset + (ushort)(bios->spreadspectrum).hlen +
                 (ushort)(bios->spreadspectrum).rlen * (short)(int)entry;
            uVar8 = bios_u8(bios,(uint)peVar10->offset,&peVar10->unk00);
            wantrlen = uVar8 | wantrlen;
            if (1 < (bios->spreadspectrum).rlen) {
              uVar8 = bios_u8(bios,peVar10->offset + 1,&peVar10->unk01);
              wantrlen = uVar8 | wantrlen;
            }
            if (wantrlen != 0) {
              return -0xe;
            }
          }
          (bios->spreadspectrum).valid = '\x01';
          bios_local._4_4_ = 0;
        }
      }
    }
    else {
      bios_local._4_4_ = -0xe;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_spreadspectrum (struct envy_bios *bios) {
	struct envy_bios_spreadspectrum *spreadspectrum = &bios->spreadspectrum;
	if (!spreadspectrum->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, spreadspectrum->offset, &spreadspectrum->version);
	err |= bios_u8(bios, spreadspectrum->offset+1, &spreadspectrum->hlen);
	err |= bios_u8(bios, spreadspectrum->offset+2, &spreadspectrum->entriesnum);
	err |= bios_u8(bios, spreadspectrum->offset+3, &spreadspectrum->rlen);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, spreadspectrum->offset, spreadspectrum->hlen + spreadspectrum->rlen * spreadspectrum->entriesnum, "SPREADSPECTRUM", -1);
	int wanthlen = 0;
	int wantrlen = 0;
	switch (spreadspectrum->version) {
		case 0x31:
		case 0x40:
			wanthlen = 10;
			wantrlen = 1;
			err |= bios_u8(bios, spreadspectrum->offset+4, &spreadspectrum->unk04);
			err |= bios_u8(bios, spreadspectrum->offset+5, &spreadspectrum->unk05);
			err |= bios_u8(bios, spreadspectrum->offset+6, &spreadspectrum->unk06);
			err |= bios_u8(bios, spreadspectrum->offset+7, &spreadspectrum->unk07);
			err |= bios_u8(bios, spreadspectrum->offset+8, &spreadspectrum->unk08);
			err |= bios_u8(bios, spreadspectrum->offset+9, &spreadspectrum->unk09);
			if (err)
				return -EFAULT;
			break;
		case 0x41:
			wanthlen = 5;
			wantrlen = 1;
			if (spreadspectrum->rlen >= 2)
				wantrlen = 2;
			err |= bios_u8(bios, spreadspectrum->offset+4, &spreadspectrum->unk04);
			if (err)
				return -EFAULT;
			break;
		default:
			ENVY_BIOS_ERR("Unknown SPREADSPECTRUM table version %d.%d\n", spreadspectrum->version >> 4, spreadspectrum->version & 0xf);
			return -EINVAL;
	}
	if (spreadspectrum->hlen < wanthlen) {
		ENVY_BIOS_ERR("SPREADSPECTRUM table header too short [%d < %d]\n", spreadspectrum->hlen, wanthlen);
		return -EINVAL;
	}
	if (spreadspectrum->rlen < wantrlen) {
		ENVY_BIOS_ERR("SPREADSPECTRUM table record too short [%d < %d]\n", spreadspectrum->rlen, wantrlen);
		return -EINVAL;
	}
	if (spreadspectrum->hlen > wanthlen) {
		ENVY_BIOS_WARN("SPREADSPECTRUM table header longer than expected [%d > %d]\n", spreadspectrum->hlen, wanthlen);
	}
	if (spreadspectrum->rlen > wantrlen) {
		ENVY_BIOS_WARN("SPREADSPECTRUM table record longer than expected [%d > %d]\n", spreadspectrum->rlen, wantrlen);
	}
	spreadspectrum->entries = calloc(spreadspectrum->entriesnum, sizeof *spreadspectrum->entries);
	if (!spreadspectrum->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < spreadspectrum->entriesnum; i++) {
		struct envy_bios_spreadspectrum_entry *entry = &spreadspectrum->entries[i];
		entry->offset = spreadspectrum->offset + spreadspectrum->hlen + spreadspectrum->rlen * i;
		err |= bios_u8(bios, entry->offset+0, &entry->unk00);
		if (spreadspectrum->rlen >= 2)
			err |= bios_u8(bios, entry->offset+1, &entry->unk01);
		if (err)
			return -EFAULT;
	}
	spreadspectrum->valid = 1;
	return 0;
}